

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (String *__return_storage_ptr__,detail *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *lhs,char *op,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_28;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *rhs_local;
  char *op_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *lhs_local;
  
  local_28 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
              __return_storage_ptr__;
  toString<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_true>
            (&local_58,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_true>
            (&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }